

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,std::array<double,1ul>,mp::LogAId>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::LogAId> *cfc,
               ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  value.size_ = 4;
  value.data_ = "LogA";
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'(');
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,int>
            (wrt,&cfc->args_,vnam);
  value_00.size_ = 2;
  value_00.data_ = ", ";
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_00);
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<double,1ul>,double>
            (wrt,&cfc->params_);
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,')');
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt,
    const CustomConstraintData<A,P,I>& cfc,
    ItemNamer& vnam) {
  wrt << cfc.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, cfc.GetArguments(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, cfc.GetParameters());
  wrt << ')';
}